

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_suite.cpp
# Opt level: O2

void enum_suite::to_enum(void)

{
  undefined4 local_40;
  enumeration result;
  variable input;
  
  input.storage.current = '\a';
  input.storage.storage._0_4_ = 0x2a;
  result = trial::dynamic::convert::
           into<enum_suite::enumeration,trial::dynamic::basic_variable<std::allocator<char>>>
                     (&input);
  local_40 = 0x2a;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,enum_suite::enumeration,enum_suite::enumeration>
            ("result","alpha",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/enum_suite.cpp"
             ,0x2f,"void enum_suite::to_enum()",&result,&local_40);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&input.storage);
  return;
}

Assistant:

void to_enum()
{
    variable input = underlying_type{alpha};
    auto result = convert::into<enumeration>(input);
    TRIAL_PROTOCOL_TEST_EQUAL(result, alpha);
}